

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_influence.h
# Opt level: O0

void __thiscall
xray_re::_influence<unsigned_int,_float>::set
          (_influence<unsigned_int,_float> *this,uint16_t bone0,uint16_t bone1,float weight0)

{
  bool bVar1;
  _bone_weight<unsigned_int,_float> local_30;
  _bone_weight<unsigned_int,_float> bw1;
  _bone_weight<unsigned_int,_float> bw0;
  float weight0_local;
  uint16_t bone1_local;
  uint16_t bone0_local;
  _influence<unsigned_int,_float> *this_local;
  
  if (bone0 == bone1) {
    _bone_weight<unsigned_int,_float>::_bone_weight(&bw0,(uint)bone0,1.0);
    _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::push_back
              (&this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>,&bw0);
  }
  else {
    _bone_weight<unsigned_int,_float>::_bone_weight(&bw1,(uint)bone0,1.0 - weight0);
    _bone_weight<unsigned_int,_float>::_bone_weight(&local_30,(uint)bone1,weight0);
    bVar1 = _bone_weight<unsigned_int,_float>::operator<(&bw1,&local_30);
    if (bVar1) {
      _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::push_back
                (&this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>,&bw1);
      _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::push_back
                (&this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>,&local_30);
    }
    else {
      _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::push_back
                (&this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>,&local_30);
      _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::push_back
                (&this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>,&bw1);
    }
  }
  return;
}

Assistant:

void _influence<Tb, Tw>::set(uint16_t bone0, uint16_t bone1, float weight0)
{
#if 0
	assert(weight0 >= 0.f && weight0 <= 1.f);
	assert(bone0 < MAX_BONES && bone1 < MAX_BONES);
#endif
	if (bone0 == bone1) {
		push_back(_bone_weight<Tb, Tw>(bone0, Tw(1)));
	} else {
		_bone_weight<Tb, Tw> bw0(bone0, Tw(1.f - weight0));
		_bone_weight<Tb, Tw> bw1(bone1, Tw(weight0));
#if 0
		xr_assert(weight0 != 0);
		xr_assert(1.f != weight0);
		xr_assert(!equivalent<Tw>(weight0, 0));
		xr_assert(!equivalent<Tw>(1.f - weight0, 0));
#endif
		if (bw0 < bw1) {
			push_back(bw0);
			push_back(bw1);
		} else {
			push_back(bw1);
			push_back(bw0);
		}
	}
}